

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeLogicalImmInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint32_t uVar2;
  uint uVar3;
  uint local_40;
  uint imm;
  uint Datasize;
  uint Rn;
  uint Rd;
  void *Decoder_local;
  uint64_t Addr_local;
  uint32_t insn_local;
  MCInst *Inst_local;
  
  RegNo = fieldFromInstruction(insn,0,5);
  RegNo_00 = fieldFromInstruction(insn,5,5);
  uVar2 = fieldFromInstruction(insn,0x1f,1);
  if (uVar2 == 0) {
    uVar3 = MCInst_getOpcode(Inst);
    if (uVar3 == 0x55) {
      DecodeGPR32RegisterClass(Inst,RegNo,Addr,Decoder);
    }
    else {
      DecodeGPR32spRegisterClass(Inst,RegNo,Addr,Decoder);
    }
    DecodeGPR32RegisterClass(Inst,RegNo_00,Addr,Decoder);
    local_40 = fieldFromInstruction(insn,10,0xc);
    _Var1 = AArch64_AM_isValidDecodeLogicalImmediate((ulong)local_40,0x20);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  else {
    uVar3 = MCInst_getOpcode(Inst);
    if (uVar3 == 0x58) {
      DecodeGPR64RegisterClass(Inst,RegNo,Addr,Decoder);
    }
    else {
      DecodeGPR64spRegisterClass(Inst,RegNo,Addr,Decoder);
    }
    DecodeGPR64RegisterClass(Inst,RegNo_00,Addr,Decoder);
    local_40 = fieldFromInstruction(insn,10,0xd);
    _Var1 = AArch64_AM_isValidDecodeLogicalImmediate((ulong)local_40,0x40);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  MCOperand_CreateImm0(Inst,(ulong)local_40);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeLogicalImmInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		void *Decoder)
{
	unsigned Rd = fieldFromInstruction(insn, 0, 5);
	unsigned Rn = fieldFromInstruction(insn, 5, 5);
	unsigned Datasize = fieldFromInstruction(insn, 31, 1);
	unsigned imm;

	if (Datasize) {
		if (MCInst_getOpcode(Inst) == AArch64_ANDSXri)
			DecodeGPR64RegisterClass(Inst, Rd, Addr, Decoder);
		else
			DecodeGPR64spRegisterClass(Inst, Rd, Addr, Decoder);
		DecodeGPR64RegisterClass(Inst, Rn, Addr, Decoder);
		imm = fieldFromInstruction(insn, 10, 13);
		if (!AArch64_AM_isValidDecodeLogicalImmediate(imm, 64))
			return Fail;
	} else {
		if (MCInst_getOpcode(Inst) == AArch64_ANDSWri)
			DecodeGPR32RegisterClass(Inst, Rd, Addr, Decoder);
		else
			DecodeGPR32spRegisterClass(Inst, Rd, Addr, Decoder);
		DecodeGPR32RegisterClass(Inst, Rn, Addr, Decoder);
		imm = fieldFromInstruction(insn, 10, 12);
		if (!AArch64_AM_isValidDecodeLogicalImmediate(imm, 32))
			return Fail;
	}

	MCOperand_CreateImm0(Inst, imm);
	return Success;
}